

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

void __thiscall FIX::DataDictionary::checkHasValue(DataDictionary *this,FieldBase *field)

{
  int field_00;
  NoTagValue *this_00;
  string local_48;
  
  if ((this->m_checkFieldsHaveValues == true) && ((field->m_string)._M_string_length == 0)) {
    this_00 = (NoTagValue *)__cxa_allocate_exception(0x58);
    field_00 = field->m_tag;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    NoTagValue::NoTagValue(this_00,field_00,&local_48);
    __cxa_throw(this_00,&NoTagValue::typeinfo,FIX::Exception::~Exception);
  }
  return;
}

Assistant:

EXCEPT(NoTagValue) {
    if (m_checkFieldsHaveValues && !field.getString().length()) {
      throw NoTagValue(field.getTag());
    }
  }